

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

void __thiscall Rml::Element::UpdateOffset(Element *this)

{
  ElementMeta *pEVar1;
  Vector2f VVar2;
  Vector2f VVar3;
  CommonValues CVar4;
  ulong uVar5;
  ulong uVar6;
  Box *this_00;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float local_58;
  float fStack_54;
  
  pEVar1 = this->meta;
  CVar4 = (pEVar1->computed_values).common;
  if ((undefined1  [96])((undefined1  [96])CVar4 & (undefined1  [96])0x20) == (undefined1  [96])0x0)
  {
    if ((undefined1  [96])((undefined1  [96])CVar4 & (undefined1  [96])0x10) ==
        (undefined1  [96])0x0) {
      (this->relative_offset_position).x = 0.0;
      fVar8 = 0.0;
    }
    else {
      if (this->offset_parent == (Element *)0x0) {
        return;
      }
      VVar2 = Box::GetSize(&this->offset_parent->main_box);
      uVar5 = *(ulong *)&(pEVar1->computed_values).common;
      uVar6 = uVar5 >> 0x28 & 3;
      if (uVar6 == 0) {
        uVar5 = uVar5 >> 0x24 & 3;
        if (uVar5 == 0) {
          fVar8 = 0.0;
        }
        else {
          fVar8 = ResolveValue((LengthPercentageAuto)
                               ((ulong)(uint)(pEVar1->computed_values).common.right_value << 0x20 |
                               uVar5),VVar2.x);
          fVar8 = -fVar8;
        }
      }
      else {
        fVar8 = ResolveValue((LengthPercentageAuto)
                             ((ulong)(uint)(pEVar1->computed_values).common.left_value << 0x20 |
                             uVar6),VVar2.x);
      }
      (this->relative_offset_position).x = fVar8;
      uVar5 = *(ulong *)&(pEVar1->computed_values).common;
      uVar6 = uVar5 >> 0x22 & 3;
      fStack_54 = VVar2.y;
      if (uVar6 == 0) {
        lVar7 = 0xcc;
        uVar5 = uVar5 >> 0x26 & 3;
        if (uVar5 == 0) {
          fVar8 = 0.0;
        }
        else {
          fVar8 = ResolveValue((LengthPercentageAuto)
                               ((ulong)(uint)(pEVar1->computed_values).common.bottom_value << 0x20 |
                               uVar5),fStack_54);
          fVar8 = -fVar8;
        }
        goto LAB_0028018d;
      }
      fVar8 = ResolveValue((LengthPercentageAuto)
                           ((ulong)(uint)(pEVar1->computed_values).common.top_value << 0x20 | uVar6)
                           ,fStack_54);
    }
    lVar7 = 0xcc;
    goto LAB_0028018d;
  }
  if (this->offset_parent == (Element *)0x0) {
    return;
  }
  this_00 = &this->offset_parent->main_box;
  VVar2 = Box::GetSize(this_00,Padding);
  CVar4 = (pEVar1->computed_values).common;
  local_58 = VVar2.x;
  if (((undefined1  [96])CVar4 & (undefined1  [96])0x30000000000) == (undefined1  [96])0x0) {
    if (((undefined1  [96])CVar4 & (undefined1  [96])0x3000000000) != (undefined1  [96])0x0) {
      fVar8 = Box::GetEdge(this_00,Border,Left);
      fVar9 = ResolveValue((LengthPercentageAuto)
                           (CONCAT44((pEVar1->computed_values).common.right_value,
                                     (uint)((ulong)*(undefined8 *)&(pEVar1->computed_values).common
                                           >> 0x24)) & 0xffffffff00000003),local_58);
      VVar3 = Box::GetSize(&this->main_box,Border);
      fVar10 = Box::GetEdge(&this->main_box,Margin,Right);
      fVar8 = (fVar8 + local_58) - (fVar10 + VVar3.x + fVar9);
      goto LAB_0027fff8;
    }
  }
  else {
    fVar8 = Box::GetEdge(this_00,Border,Left);
    fVar9 = ResolveValue((LengthPercentageAuto)
                         (CONCAT44((pEVar1->computed_values).common.left_value,
                                   (uint)((ulong)*(undefined8 *)&(pEVar1->computed_values).common >>
                                         0x28)) & 0xffffffff00000003),local_58);
    fVar10 = Box::GetEdge(&this->main_box,Margin,Left);
    fVar8 = fVar10 + fVar9 + fVar8;
LAB_0027fff8:
    (this->relative_offset_base).x = fVar8;
  }
  CVar4 = (pEVar1->computed_values).common;
  fStack_54 = VVar2.y;
  if (((undefined1  [96])CVar4 & (undefined1  [96])0xc00000000) == (undefined1  [96])0x0) {
    if (((undefined1  [96])CVar4 & (undefined1  [96])0xc000000000) == (undefined1  [96])0x0) {
      return;
    }
    fVar8 = Box::GetEdge(this_00,Border,Top);
    fVar9 = ResolveValue((LengthPercentageAuto)
                         (CONCAT44((pEVar1->computed_values).common.bottom_value,
                                   (uint)((ulong)*(undefined8 *)&(pEVar1->computed_values).common >>
                                         0x26)) & 0xffffffff00000003),fStack_54);
    VVar2 = Box::GetSize(&this->main_box,Border);
    fVar10 = Box::GetEdge(&this->main_box,Margin,Bottom);
    fVar8 = (fVar8 + fStack_54) - (fVar10 + VVar2.y + fVar9);
  }
  else {
    fVar8 = Box::GetEdge(this_00,Border,Top);
    fVar9 = ResolveValue((LengthPercentageAuto)
                         (CONCAT44((pEVar1->computed_values).common.top_value,
                                   (uint)((ulong)*(undefined8 *)&(pEVar1->computed_values).common >>
                                         0x22)) & 0xffffffff00000003),fStack_54);
    fVar10 = Box::GetEdge(&this->main_box,Margin,Top);
    fVar8 = fVar10 + fVar9 + fVar8;
  }
  lVar7 = 0xc4;
LAB_0028018d:
  *(float *)((long)&(this->super_ScriptInterface).super_Releasable._vptr_Releasable + lVar7) = fVar8
  ;
  return;
}

Assistant:

void Element::UpdateOffset()
{
	using namespace Style;
	const auto& computed = meta->computed_values;
	Position position_property = computed.position();

	if (position_property == Position::Absolute || position_property == Position::Fixed)
	{
		if (offset_parent != nullptr)
		{
			const Box& parent_box = offset_parent->GetBox();
			Vector2f containing_block = parent_box.GetSize(BoxArea::Padding);

			// If the element is anchored left, then the position is offset by that resolved value.
			if (computed.left().type != Left::Auto)
				relative_offset_base.x = parent_box.GetEdge(BoxArea::Border, BoxEdge::Left) +
					(ResolveValue(computed.left(), containing_block.x) + GetBox().GetEdge(BoxArea::Margin, BoxEdge::Left));

			// If the element is anchored right, then the position is set first so the element's right-most edge
			// (including margins) will render up against the containing box's right-most content edge, and then
			// offset by the resolved value.
			else if (computed.right().type != Right::Auto)
			{
				relative_offset_base.x = containing_block.x + parent_box.GetEdge(BoxArea::Border, BoxEdge::Left) -
					(ResolveValue(computed.right(), containing_block.x) + GetBox().GetSize(BoxArea::Border).x +
						GetBox().GetEdge(BoxArea::Margin, BoxEdge::Right));
			}

			// If the element is anchored top, then the position is offset by that resolved value.
			if (computed.top().type != Top::Auto)
			{
				relative_offset_base.y = parent_box.GetEdge(BoxArea::Border, BoxEdge::Top) +
					(ResolveValue(computed.top(), containing_block.y) + GetBox().GetEdge(BoxArea::Margin, BoxEdge::Top));
			}

			// If the element is anchored bottom, then the position is set first so the element's right-most edge
			// (including margins) will render up against the containing box's right-most content edge, and then
			// offset by the resolved value.
			else if (computed.bottom().type != Bottom::Auto)
			{
				relative_offset_base.y = containing_block.y + parent_box.GetEdge(BoxArea::Border, BoxEdge::Top) -
					(ResolveValue(computed.bottom(), containing_block.y) + GetBox().GetSize(BoxArea::Border).y +
						GetBox().GetEdge(BoxArea::Margin, BoxEdge::Bottom));
			}
		}
	}
	else if (position_property == Position::Relative)
	{
		if (offset_parent != nullptr)
		{
			const Box& parent_box = offset_parent->GetBox();
			Vector2f containing_block = parent_box.GetSize();

			if (computed.left().type != Left::Auto)
				relative_offset_position.x = ResolveValue(computed.left(), containing_block.x);
			else if (computed.right().type != Right::Auto)
				relative_offset_position.x = -1 * ResolveValue(computed.right(), containing_block.x);
			else
				relative_offset_position.x = 0;

			if (computed.top().type != Top::Auto)
				relative_offset_position.y = ResolveValue(computed.top(), containing_block.y);
			else if (computed.bottom().type != Bottom::Auto)
				relative_offset_position.y = -1 * ResolveValue(computed.bottom(), containing_block.y);
			else
				relative_offset_position.y = 0;
		}
	}
	else
	{
		relative_offset_position.x = 0;
		relative_offset_position.y = 0;
	}
}